

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInternalForces
          (ChElementShellReissner4 *this,ChVectorDynamic<> *Fi)

{
  ChVectorN<double,_12> *vector;
  ChVector<double> *pCVar1;
  ChVector<double> *der1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer pLVar13;
  pointer pdVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  double *pdVar30;
  ChMatrixNM<double,_15,_24> *xpr;
  double dVar31;
  double dVar32;
  Scalar *pSVar33;
  int i;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *pMVar34;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *this_00;
  MatrixBase<Eigen::Matrix<double,12,24,1,12,24>> *this_01;
  long lVar35;
  ChMatrix33<double> *pCVar36;
  ChMatrixNM<double,_12,_24> *pCVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  Index startCol;
  ChVectorN<double,_12> *vector_00;
  PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_> *xpr_00;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *pMVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ChMatrix33<double> Phi_Delta_A_n_LI_i;
  ChVector<double> l_m1_1;
  ChVector<double> l_n2_1;
  ChVector<double> l_n1_1;
  ChVector<double> l_m2_1;
  ChVectorN<double,_12> strain_dt;
  ChVector<double> k_tot_2;
  ChVector<double> k_tot_1;
  ChVector<double> eps_tot_2;
  ChVector<double> eps_tot_1;
  ChVector<double> Tm2;
  ChVector<double> Tm1;
  ChVector<double> Tn2;
  ChVector<double> Tn1;
  ChVector<double> l_n2;
  ChVector<double> l_n1;
  ChVector<double> y_A_2;
  ChVector<double> l_m2;
  ChVector<double> l_m1;
  ChVector<double> y_A_1;
  ChVectorN<double,_24> rd;
  ChVectorN<double,_12> stress_damp;
  ChStateDelta velocities;
  ChVector<double> eps_dt_1;
  ChVector<double> k_dt_2;
  ChVector<double> k_dt_1;
  ChVector<double> eps_dt_2;
  ChMatrixNM<double,_6,_24> B_overline_A;
  ChMatrixNM<double,_4,_24> B_overline_3_ABCD;
  ChMatrixNM<double,_4,_24> B_overline_6_ABCD;
  ChVectorN<double,_12> *local_1268;
  long local_1258;
  undefined1 local_1248 [80];
  ChMatrix33<double> local_11f8;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *local_11b0;
  ChMatrixNM<double,_12,_24> *local_11a8;
  ChVector<double> *local_11a0;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *local_1198;
  ChMatrixNM<double,_12,_24> *local_1190;
  ChMatrix33<double> *local_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [40];
  double dStack_1118;
  double local_1110;
  double *local_1100;
  ChVector<double> *local_10f8;
  ChVector<double> *local_10f0;
  ChVector<double> *local_10e8;
  ChMatrixNM<double,_15,_24> *local_10e0;
  ChMatrix33<double> *local_10d8;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *local_10d0;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *local_10c8;
  undefined1 local_10c0 [144];
  undefined1 local_1030 [32];
  undefined1 local_1010 [32];
  undefined1 local_ff0 [32];
  Matrix<double,_3,_3,_1,_3,_3> local_fd0;
  ChVector<double> *local_f88;
  ChVector<double> *local_f80;
  ChVector<double> *local_f78;
  ChVector<double> local_f70;
  ChVector<double> local_f50;
  ChVector<double> local_f30;
  ChVector<double> local_f10;
  MatrixBase<Eigen::Matrix<double,12,24,1,12,24>> *local_ef0;
  double dStack_ee8;
  double local_ee0;
  double local_ed0;
  double dStack_ec8;
  double local_ec0;
  ChVector<double> local_eb0;
  ChMatrixNM<double,_15,_24> *local_e90;
  ChVector<double> *local_e88;
  ChVector<double> *local_e80;
  ChVector<double> *local_e78;
  ChVector<double> *local_e70;
  ChMatrixNM<double,_4,_2> *local_e68;
  double local_e60;
  double dStack_e58;
  double local_e50;
  double local_e40;
  double dStack_e38;
  double local_e30;
  ChVector<double> local_e20;
  undefined1 local_e00 [8];
  undefined1 auStack_df8 [16];
  double local_de8;
  double local_de0;
  double local_dd8;
  LhsNested pMStack_dd0;
  RhsNested local_dc8;
  double local_dc0;
  ChMatrix33<double> *local_d68;
  undefined1 local_d20 [112];
  ChMatrix33<double> local_cb0;
  Matrix<double,_3,_3,_1,_3,_3> local_c68;
  Matrix<double,_3,_3,_1,_3,_3> local_c20;
  ChMatrix33<double> local_bd8;
  Matrix<double,_3,_3,_1,_3,_3> local_b90;
  ChMatrix33<double> local_b48;
  Matrix<double,_6,_24,_1,_6,_24> local_b00;
  Matrix<double,_4,_24,_1,_4,_24> local_680;
  Matrix<double,_4,_24,_1,_4,_24> local_380;
  
  local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)Fi;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fi);
  UpdateNodalAndAveragePosAndOrientation(this);
  InterpolateOrientation(this);
  ComputeIPCurvature(this);
  local_e68 = this->L_alpha_beta_i;
  local_10f0 = this->y_i_1;
  local_f78 = this->xa;
  local_10f8 = this->y_i_2;
  local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (double)this->T_i;
  local_f80 = this->eps_tilde_1_i;
  local_e70 = this->eps_tilde_1_0_i;
  local_f88 = this->eps_tilde_2_i;
  local_e78 = this->eps_tilde_2_0_i;
  local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (double)this->k_1_i;
  local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (double)this->k_tilde_1_i;
  local_e80 = this->k_tilde_1_0_i;
  local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)this->k_2_i;
  local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)this->k_tilde_2_i;
  local_e88 = this->k_tilde_2_0_i;
  local_11b0 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this->Phi_Delta_i;
  local_11a8 = this->B_overline_i;
  local_10e8 = this->phi_tilde_n;
  local_e90 = this->D_overline_i;
  local_1100 = (double *)&xi_i;
  lVar35 = 0;
  while (lVar35 != 4) {
    local_1248._72_8_ = local_e68 + lVar35;
    pCVar1 = local_10f8 + lVar35;
    der1 = local_10f0 + lVar35;
    local_11a0 = (ChVector<double> *)lVar35;
    InterpDeriv(local_f78,(ChMatrixNM<double,_4,_2> *)local_1248._72_8_,der1,pCVar1);
    pMVar41 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)
              ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6] + lVar35 * 0x48);
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [0] = (double)pMVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_680,der1);
    auVar24._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[1];
    auVar24._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[0];
    dVar2 = local_e70[lVar35].m_data[2];
    auVar42 = vsubpd_avx(auVar24,*(undefined1 (*) [16])local_e70[lVar35].m_data);
    *(undefined1 (*) [16])local_f80[lVar35].m_data = auVar42;
    local_f80[lVar35].m_data[2] =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[2] - dVar2;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [0] = (double)pMVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_680,pCVar1);
    dVar32 = local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[5];
    auVar25._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[1];
    auVar25._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[0];
    dVar2 = local_e78[lVar35].m_data[2];
    auVar42 = vsubpd_avx(auVar25,*(undefined1 (*) [16])local_e78[lVar35].m_data);
    *(undefined1 (*) [16])local_f88[lVar35].m_data = auVar42;
    local_f88[lVar35].m_data[2] =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[2] - dVar2;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [0] = (double)pMVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_680,
                      (ChVector<double> *)
                      ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[5] + lVar35 * 0x18));
    dVar31 = local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[4];
    auVar26._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[1];
    auVar26._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[0];
    dVar2 = local_e80[lVar35].m_data[2];
    auVar42 = vsubpd_avx(auVar26,*(undefined1 (*) [16])local_e80[lVar35].m_data);
    *(undefined1 (*) [16])
     ((ChVector<double> *)
     ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] + lVar35 * 0x18))->m_data = auVar42;
    ((ChVector<double> *)
    ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[8] + lVar35 * 0x18))->m_data[2] =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[2] - dVar2;
    local_10d0 = pMVar41;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [0] = (double)pMVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_680,
                      (ChVector<double> *)
                      ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[4] + lVar35 * 0x18));
    auVar27._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[1];
    auVar27._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[0];
    dVar2 = local_e88[lVar35].m_data[2];
    auVar42 = vsubpd_avx(auVar27,*(undefined1 (*) [16])local_e88[lVar35].m_data);
    *(undefined1 (*) [16])
     ((ChVector<double> *)
     ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[7] + lVar35 * 0x18))->m_data = auVar42;
    ((ChVector<double> *)
    ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[7] + lVar35 * 0x18))->m_data[2] =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[2] - dVar2;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [0] = 0.0;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [3] = local_10f0[lVar35].m_data[2];
    auVar55._0_8_ =
         -local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
          array[3];
    auVar55._8_8_ = 0x8000000000000000;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar55);
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [4] = 0.0;
    auVar42 = *(undefined1 (*) [16])local_10f0[lVar35].m_data;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [2] = local_10f0[lVar35].m_data[1];
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [0] = 0.0;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [5] = -auVar42._0_8_;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [6] = -auVar42._8_8_;
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [7] = (double)vmovlpd_avx(auVar42);
    local_b00.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [8] = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [3] = local_10f8[lVar35].m_data[2];
    auVar56._0_8_ =
         -local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.
          array[3];
    auVar56._8_8_ = 0x8000000000000000;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar56);
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [4] = 0.0;
    auVar42 = *(undefined1 (*) [16])local_10f8[lVar35].m_data;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [2] = local_10f8[lVar35].m_data[1];
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [0] = 0.0;
    local_10d8 = (ChMatrix33<double> *)(&xi_i + (long)local_11a0 * 2);
    local_1190 = local_11a8 + (long)local_11a0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [5] = -auVar42._0_8_;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [6] = -auVar42._8_8_;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [7] = (double)vmovlpd_avx(auVar42);
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [8] = 0.0;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [3] = ((ChVector<double> *)((long)dVar32 + lVar35 * 0x18))->m_data[2];
    local_10e0 = local_e90 + (long)local_11a0;
    auVar57._0_8_ =
         -local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.
          array[3];
    auVar57._8_8_ = 0x8000000000000000;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar57);
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [4] = 0.0;
    auVar42 = *(undefined1 (*) [16])((ChVector<double> *)((long)dVar32 + lVar35 * 0x18))->m_data;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [2] = ((ChVector<double> *)((long)dVar32 + lVar35 * 0x18))->m_data[1];
    local_e00 = (undefined1  [8])0x0;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [5] = -auVar42._0_8_;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [6] = -auVar42._8_8_;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [7] = (double)vmovlpd_avx(auVar42);
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_4,_24,_1,_4,_24>_>.m_storage.m_data.array
    [8] = 0.0;
    local_de8 = ((ChVector<double> *)((long)dVar31 + lVar35 * 0x18))->m_data[2];
    auVar58._0_8_ = -local_de8;
    auVar58._8_8_ = 0x8000000000000000;
    auStack_df8._0_8_ = vmovlpd_avx(auVar58);
    local_de0 = 0.0;
    auVar42 = *(undefined1 (*) [16])((ChVector<double> *)((long)dVar31 + lVar35 * 0x18))->m_data;
    auStack_df8._8_8_ = ((ChVector<double> *)((long)dVar31 + lVar35 * 0x18))->m_data[1];
    startCol = 0;
    local_dd8 = -auVar42._0_8_;
    pMStack_dd0 = (LhsNested)((ulong)auVar42._8_8_ ^ 0x8000000000000000);
    local_dc8 = (RhsNested)vmovlpd_avx(auVar42);
    local_dc0 = 0.0;
    local_1258 = 0;
    pMVar41 = local_11b0;
    for (lVar35 = -0x20; lVar35 != 0; lVar35 = lVar35 + 8) {
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)(**(code **)(vtable + lVar35))(local_10d8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248,pMVar41,(double *)&local_11f8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_d20,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)local_1248);
      pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)
                           local_1248._72_8_,local_1258,0);
      pMVar34 = local_10d0;
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248,local_10d0,pSVar33);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248);
      pCVar37 = local_1190;
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_10c0;
      Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 local_1190,0,startCol,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_11f8);
      local_1248._8_8_ = &local_b00;
      local_1248._16_8_ = local_d20;
      local_1248._0_8_ = pMVar34;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      local_1248._8_8_ =
           *(long *)((long)&(this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar35 * 2) + 0x58;
      local_1248._0_8_ = (ChMatrixNM<double,_12,_24> *)local_10c0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      local_1188 = (ChMatrix33<double> *)(startCol + 3);
      Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 pCVar37,0,(Index)local_1188,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      uVar29 = local_1248._72_8_;
      pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)
                           local_1248._72_8_,local_1258,1);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248,pMVar34,pSVar33);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_10c0;
      Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 pCVar37,3,startCol,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_11f8);
      local_1248._8_8_ = &local_680;
      local_1248._16_8_ = local_d20;
      local_1248._0_8_ = pMVar34;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      local_1248._0_8_ = local_10c0;
      local_1248._8_8_ =
           *(long *)((long)&(this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar35 * 2) + 0x58;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_1248._0_8_,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      pCVar36 = local_1188;
      Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 pCVar37,3,(Index)local_1188,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      InterpDeriv(local_10e8,(ChMatrixNM<double,_4,_2> *)uVar29,(ChVector<double> *)&local_11f8,
                  (ChVector<double> *)&local_c68);
      local_1248._8_8_ = &local_380;
      local_1248._16_8_ = local_d20;
      local_1248._0_8_ = pMVar34;
      local_1248._24_8_ = pMVar34;
      local_1248._32_8_ = pMVar41 + 0x900;
      local_1198 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_1248._32_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1248);
      local_1248._8_8_ =
           *(long *)((long)&(this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar35 * 2) + 0x58;
      local_1248._0_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      pCVar37 = local_1190;
      Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 local_1190,6,(Index)pCVar36,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      local_1248._8_8_ = local_e00;
      local_1248._16_8_ = local_d20;
      local_1248._0_8_ = pMVar34;
      local_1248._24_8_ = pMVar34;
      local_1248._32_8_ = pMVar41 + 0xd80;
      local_10c8 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_1248._32_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)local_1248);
      local_1248._8_8_ =
           *(long *)((long)&(this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar35 * 2) + 0x58;
      local_1248._0_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 pCVar37,9,(Index)pCVar36,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::Identity();
      uVar29 = local_1248._72_8_;
      pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)
                           local_1248._72_8_,local_1258,0);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
      ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                   *)local_1248,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
                   *)&local_cb0,pSVar33);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248);
      xpr = local_10e0;
      Eigen::Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,
                 local_10e0,0,startCol,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,15,24,1,15,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::Identity();
      pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)uVar29,
                           local_1258,1);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
      ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                   *)local_1248,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>>
                   *)&local_cb0,pSVar33);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1248);
      Eigen::Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,xpr,3,
                 startCol,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,15,24,1,15,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      local_1248._8_8_ =
           *(long *)((long)&(this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar35 * 2) + 0x58;
      local_1248._0_8_ = local_1198;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      pCVar36 = local_1188;
      Eigen::Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,xpr,6,
                 (Index)local_1188,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,15,24,1,15,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      local_1248._8_8_ =
           *(long *)((long)&(this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar35 * 2) + 0x58;
      local_1248._0_8_ = local_10c8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      Eigen::Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,xpr,9,
                 (Index)pCVar36,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,15,24,1,15,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      local_1248._8_8_ =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (*(long *)((long)&(this->m_nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar35 * 2) + 0x58);
      local_1248._0_8_ = (non_const_type)local_d20;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_10c0,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)local_1248);
      Eigen::Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,xpr,
                 0xc,(Index)pCVar36,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,15,24,1,15,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_15,_24,_1,_15,_24>,__1,__1,_false> *)local_1248,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
      local_1258 = local_1258 + 1;
      pMVar41 = pMVar41 + 0x48;
      startCol = startCol + 6;
    }
    local_11b0 = local_11b0 + 0x120;
    lVar35 = (long)local_11a0 + 1;
  }
  local_e20.m_data[2] = 0.0;
  local_eb0.m_data[2] = 0.0;
  local_e20.m_data[0] = 0.0;
  local_e20.m_data[1] = 0.0;
  local_eb0.m_data[0] = 0.0;
  local_eb0.m_data[1] = 0.0;
  local_10d8 = this->T_A;
  local_10e0 = (ChMatrixNM<double,_15,_24> *)this->eps_tilde_1_A;
  local_10d0 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this->L_alpha_beta_A;
  local_1198 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this->Phi_Delta_A;
  local_10e8 = this->eps_tilde_1_0_A;
  local_11a0 = this->eps_tilde_2_A;
  local_11b0 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this->eps_tilde_2_0_A;
  for (pMVar41 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)0x0;
      pMVar41 != (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)0x4; pMVar41 = pMVar41 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_> *)&local_b00);
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)
              ((long)local_10d0 + pMVar41 * 0x40);
    InterpDeriv(local_f78,(ChMatrixNM<double,_4,_2> *)this_00,&local_e20,&local_eb0);
    pCVar36 = local_10d8 + (long)pMVar41;
    local_10c0._0_8_ = pCVar36;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_10c0,&local_e20);
    auVar22._8_8_ = auStack_df8._0_8_;
    auVar22._0_8_ = local_e00;
    dVar2 = local_10e8[(long)pMVar41].m_data[2];
    auVar42 = vsubpd_avx(auVar22,*(undefined1 (*) [16])local_10e8[(long)pMVar41].m_data);
    *(undefined1 (*) [16])((ChVector<double> *)((long)local_10e0 + pMVar41 * 0x18))->m_data =
         auVar42;
    ((ChVector<double> *)((long)local_10e0 + pMVar41 * 0x18))->m_data[2] =
         (double)auStack_df8._8_8_ - dVar2;
    local_1188 = pCVar36;
    local_10c0._0_8_ = pCVar36;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_10c0,&local_eb0);
    auVar23._8_8_ = auStack_df8._0_8_;
    auVar23._0_8_ = local_e00;
    local_1190 = (ChMatrixNM<double,_12,_24> *)(xi_A + (long)pMVar41 * 0x10);
    dVar2 = ((ChVector<double> *)((long)local_11b0 + pMVar41 * 0x18))->m_data[2];
    auVar42 = vsubpd_avx(auVar23,*(undefined1 (*) [16])
                                  ((ChVector<double> *)((long)local_11b0 + pMVar41 * 0x18))->m_data)
    ;
    lVar39 = 0;
    *(undefined1 (*) [16])local_11a0[(long)pMVar41].m_data = auVar42;
    local_11a0[(long)pMVar41].m_data[2] = (double)auStack_df8._8_8_ - dVar2;
    local_e00 = (undefined1  [8])0x0;
    local_10c0._0_8_ = (non_const_type)0x0;
    auVar59._0_8_ = -local_e20.m_data[2];
    auVar59._8_8_ = 0x8000000000000000;
    auStack_df8._0_8_ = vmovlpd_avx(auVar59);
    local_de8 = local_e20.m_data[2];
    auVar21._8_8_ = local_e20.m_data[1];
    auVar21._0_8_ = local_e20.m_data[0];
    local_de0 = 0.0;
    auStack_df8._8_8_ = local_e20.m_data[1];
    local_dd8 = -local_e20.m_data[0];
    pMStack_dd0 = (LhsNested)((ulong)local_e20.m_data[1] ^ 0x8000000000000000);
    local_dc8 = (RhsNested)vmovlpd_avx(auVar21);
    local_dc0 = 0.0;
    auVar60._0_8_ = -local_eb0.m_data[2];
    auVar60._8_8_ = 0x8000000000000000;
    local_10c0._8_8_ = vmovlpd_avx(auVar60);
    local_10c0._24_8_ = local_eb0.m_data[2];
    auVar20._8_8_ = local_eb0.m_data[1];
    auVar20._0_8_ = local_eb0.m_data[0];
    local_10c0._32_8_ = 0.0;
    local_10c0._16_8_ = local_eb0.m_data[1];
    local_10c0._40_8_ = (ulong)local_eb0.m_data[0] ^ 0x8000000000000000;
    local_10c0._48_8_ = (ulong)local_eb0.m_data[1] ^ 0x8000000000000000;
    local_10c0._56_8_ = vmovlpd_avx(auVar20);
    local_10c0._64_8_ = (RhsNested)0x0;
    local_1268 = (ChVectorN<double,_12> *)0x0;
    pMVar34 = local_1198;
    local_10c8 = pMVar41;
    for (lVar35 = -0x20; lVar35 != 0; lVar35 = lVar35 + 8) {
      local_c68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)(**(code **)(vtable + lVar35))(local_1190);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)&local_11f8,pMVar34,(double *)&local_c68);
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_1248,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)&local_11f8);
      pCVar36 = local_1188;
      local_c68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_1188;
      pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                          (this_00,(Index)local_1268,0);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)&local_11f8,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>> *)&local_c68,pSVar33
                );
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)&local_11f8);
      Eigen::Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 &local_b00,0,lVar39,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_d20);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_e00;
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_1248;
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)pCVar36;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
                 (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_11f8);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)(*(long *)((long)&(this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[4].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar35 * 2) + 0x58);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_d20;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_11f8);
      local_1248._72_8_ = lVar39 + 3;
      Eigen::Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 &local_b00,0,local_1248._72_8_,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_d20);
      local_c68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)pCVar36;
      pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                          (this_00,(Index)local_1268,1);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)&local_11f8,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>> *)&local_c68,pSVar33
                );
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)&local_11f8);
      Eigen::Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 &local_b00,3,lVar39,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_d20);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_10c0;
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_1248;
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)pCVar36;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
                 (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_11f8);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)(*(long *)((long)&(this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[4].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar35 * 2) + 0x58);
      local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_d20;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_11f8);
      Eigen::Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 &local_b00,3,local_1248._72_8_,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
                ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,__1,__1,_false> *)&local_11f8,
                 (Matrix<double,_3,_3,_1,_3,_3> *)local_d20);
      local_1268 = (ChVectorN<double,_12> *)((long)local_1268 + 1);
      pMVar34 = pMVar34 + 0x48;
      lVar39 = lVar39 + 6;
    }
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                    local_1248,&local_b00,2);
    pMVar41 = local_10c8;
    Eigen::Block<Eigen::Matrix<double,_4,_24,_1,_4,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_4,_24,_1,_4,_24>,_1,_24,_true> *)&local_11f8,&local_680,
               (Index)local_10c8);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,24,1,4,24>,1,24,true>,Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>>
              ((Block<Eigen::Matrix<double,_4,_24,_1,_4,_24>,_1,_24,_true> *)&local_11f8,
               (Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1248);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                    local_1248,&local_b00,5);
    Eigen::Block<Eigen::Matrix<double,_4,_24,_1,_4,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_4,_24,_1,_4,_24>,_1,_24,_true> *)&local_11f8,&local_380,
               (Index)pMVar41);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,24,1,4,24>,1,24,true>,Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>>
              ((Block<Eigen::Matrix<double,_4,_24,_1,_4,_24>,_1,_24,_true> *)&local_11f8,
               (Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1248);
    local_1198 = local_1198 + 0x120;
  }
  local_1100 = local_1100 + 1;
  pCVar37 = local_11a8;
  for (lVar35 = 18000; pdVar30 = local_1100, lVar35 != 0x46b0; lVar35 = lVar35 + 0x18) {
    local_d20._0_8_ = 0.0;
    local_1248._0_8_ = local_10c0;
    local_1248._8_8_ = &local_680;
    local_10c0._0_8_ = (*local_1100 + 1.0) * 0.5;
    local_d20._8_8_ = (1.0 - local_1100[-1]) * 0.5;
    local_10c0._16_8_ = (1.0 - *local_1100) * 0.5;
    local_d20._24_8_ = (local_1100[-1] + 1.0) * 0.5;
    local_10c0._8_8_ = 0.0;
    local_d20._16_8_ = 0.0;
    local_10c0._24_8_ = (non_const_type)0x0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->eps_tilde_1_A[0].m_data[2];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (double)local_10c0._16_8_ * this->eps_tilde_1_A[2].m_data[2];
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_10c0._0_8_;
    auVar42 = vfmadd231sd_fma(auVar43,auVar61,auVar3);
    *(long *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase + lVar35) = auVar42._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->eps_tilde_2_A[1].m_data[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (double)local_d20._24_8_ * this->eps_tilde_2_A[3].m_data[2];
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_d20._8_8_;
    auVar42 = vfmadd231sd_fma(auVar44,auVar70,auVar4);
    *(long *)((long)(this->m_MassMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar35 + -0x60) = auVar42._0_8_;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_1,_24,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_1,_24,_true,_true> *)
                    local_e00,pCVar37,2);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,1,24,true>,Eigen::Product<Eigen::Matrix<double,1,4,1,1,4>,Eigen::Matrix<double,4,24,1,4,24>,0>>
              ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_1,_24,_true> *)local_e00,
               (Product<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_4,_24,_1,_4,_24>,_0>
                *)local_1248);
    local_1248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_380;
    local_1248._0_8_ = (non_const_type)local_d20;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_1,_24,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_1,_24,_true,_true> *)
                    local_e00,pCVar37,5);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,1,24,true>,Eigen::Product<Eigen::Matrix<double,1,4,1,1,4>,Eigen::Matrix<double,4,24,1,4,24>,0>>
              ((Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_1,_24,_true> *)local_e00,
               (Product<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_4,_24,_1,_4,_24>,_0>
                *)local_1248);
    local_1100 = pdVar30 + 2;
    pCVar37 = pCVar37 + 1;
  }
  vector = &this->epsilon;
  local_1268 = this->stress_i;
  for (lVar35 = 0; lVar35 != 4; lVar35 = lVar35 + 1) {
    local_10c0._0_8_ = local_f80 + lVar35;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    local_10c0._0_8_ = local_f88 + lVar35;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    local_10c0._0_8_ =
         (long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[8] + lVar35 * 0x18;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    local_10c0._0_8_ =
         (long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7] + lVar35 * 0x18;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,0,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)(local_ff0 + 0x20),
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_e00,(type *)0x0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,3,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_ff0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_e00,(type *)0x0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,6,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_1010,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_e00,(type *)0x0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector,9,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_1030,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_e00,(type *)0x0);
    local_1140._16_8_ = 0.0;
    local_1160._16_8_ = 0.0;
    local_1180._16_8_ = 0.0;
    local_1110 = 0.0;
    local_ec0 = 0.0;
    local_ee0 = 0.0;
    local_e30 = 0.0;
    local_e50 = 0.0;
    local_1140._0_8_ = 0.0;
    local_1140._8_8_ = 0.0;
    local_1160._0_8_ = 0.0;
    local_1160._8_8_ = 0.0;
    local_1180._0_8_ = 0.0;
    local_1180._8_8_ = 0.0;
    local_1140._32_8_ = 0.0;
    dStack_1118 = 0.0;
    local_ed0 = 0.0;
    dStack_ec8 = 0.0;
    local_ef0 = (MatrixBase<Eigen::Matrix<double,12,24,1,12,24>> *)0x0;
    dStack_ee8 = 0.0;
    local_e40 = 0.0;
    dStack_e38 = 0.0;
    local_e60 = 0.0;
    dStack_e58 = 0.0;
    lVar39 = 0x20;
    uVar40 = 0;
    while( true ) {
      pLVar13 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar13) / 0x28) <=
          uVar40) break;
      std::__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )local_e00,
                   (__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )((long)pLVar13 + lVar39 + -0x18));
      pdVar14 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      (**(code **)(*(long *)local_e00 + 0x10))
                (pdVar14[uVar40],pdVar14[uVar40 + 1],
                 *(undefined8 *)
                  ((long)&((this->m_layers).
                           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_element + lVar39),local_e00
                 ,&local_ed0,&local_ef0,&local_e40,&local_e60,local_ff0 + 0x20,local_ff0,local_1010,
                 local_1030,0,0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_df8);
      lVar39 = lVar39 + 0x28;
      uVar40 = uVar40 + 1;
      local_1140._0_8_ = local_ed0 + (double)local_1140._0_8_;
      local_1140._8_8_ = dStack_ec8 + (double)local_1140._8_8_;
      local_1140._16_8_ = local_ec0 + (double)local_1140._16_8_;
      local_1160._0_8_ = (double)local_ef0 + (double)local_1160._0_8_;
      local_1160._8_8_ = dStack_ee8 + (double)local_1160._8_8_;
      local_1160._16_8_ = local_ee0 + (double)local_1160._16_8_;
      local_1180._0_8_ = local_e40 + (double)local_1180._0_8_;
      local_1180._8_8_ = dStack_e38 + (double)local_1180._8_8_;
      local_1180._16_8_ = local_e30 + (double)local_1180._16_8_;
      local_1140._32_8_ = local_e60 + (double)local_1140._32_8_;
      dStack_1118 = dStack_e58 + dStack_1118;
      local_1110 = local_e50 + local_1110;
    }
    local_10c0._0_8_ = local_1140;
    vector_00 = local_1268 + lVar35;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector_00,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    local_10c0._0_8_ = local_1160;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector_00,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    local_10c0._0_8_ = local_1180;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector_00,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    local_10c0._0_8_ = (non_const_type)(local_1140 + 0x20);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_e00,vector_00,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_e00,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_10c0);
    pCVar36 = (ChMatrix33<double> *)
              ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6] + lVar35 * 0x48);
    ChMatrix33<double>::operator*(pCVar36,(ChVector<double> *)local_1140);
    ChMatrix33<double>::operator*(pCVar36,(ChVector<double> *)local_1160);
    ChMatrix33<double>::operator*(pCVar36,(ChVector<double> *)local_1180);
    ChMatrix33<double>::operator*(pCVar36,(ChVector<double> *)(local_1140 + 0x20));
    pCVar1 = local_10f0;
    TensorProduct<double>(&local_f10,local_10f0 + lVar35);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_f10.m_data[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pCVar1[lVar35].m_data[0];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_f10.m_data[1] * pCVar1[lVar35].m_data[1];
    auVar42 = vfmadd231sd_fma(auVar62,auVar45,auVar5);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_f10.m_data[2];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pCVar1[lVar35].m_data[2];
    auVar42 = vfmadd132sd_fma(auVar46,auVar42,auVar6);
    ChMatrix33<double>::ChMatrix33(&local_11f8,auVar42._0_8_);
    pCVar1 = local_10f8;
    TensorProduct<double>(&local_f30,local_10f8 + lVar35);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_f30.m_data[0];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pCVar1[lVar35].m_data[0];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_f30.m_data[1] * pCVar1[lVar35].m_data[1];
    auVar42 = vfmadd231sd_fma(auVar63,auVar47,auVar7);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_f30.m_data[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pCVar1[lVar35].m_data[2];
    auVar42 = vfmadd132sd_fma(auVar48,auVar42,auVar8);
    ChMatrix33<double>::ChMatrix33(&local_cb0,auVar42._0_8_);
    dVar2 = local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[5];
    TensorProduct<double>
              (&local_f50,
               (ChVector<double> *)
               ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[5] + lVar35 * 0x18));
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_f50.m_data[0];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = ((ChVector<double> *)((long)dVar2 + lVar35 * 0x18))->m_data[0];
    auVar64._8_8_ = 0;
    auVar64._0_8_ =
         local_f50.m_data[1] * ((ChVector<double> *)((long)dVar2 + lVar35 * 0x18))->m_data[1];
    auVar42 = vfmadd231sd_fma(auVar64,auVar49,auVar9);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_f50.m_data[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = ((ChVector<double> *)((long)dVar2 + lVar35 * 0x18))->m_data[2];
    auVar42 = vfmadd132sd_fma(auVar50,auVar42,auVar10);
    ChMatrix33<double>::ChMatrix33(&local_b48,auVar42._0_8_);
    dVar2 = local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[4];
    TensorProduct<double>
              (&local_f70,
               (ChVector<double> *)
               ((long)local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[4] + lVar35 * 0x18));
    local_10c0._40_8_ = local_1248;
    local_10c0._48_8_ = &local_11f8;
    local_10c0._64_8_ = &local_c68;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_f70.m_data[0];
    local_10c0._80_8_ = &local_cb0;
    local_10c0._96_8_ = &local_c20;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = ((ChVector<double> *)((long)dVar2 + lVar35 * 0x18))->m_data[0];
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         local_f70.m_data[1] * ((ChVector<double> *)((long)dVar2 + lVar35 * 0x18))->m_data[1];
    auVar42 = vfmadd231sd_fma(auVar65,auVar51,auVar11);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_f70.m_data[2];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = ((ChVector<double> *)((long)dVar2 + lVar35 * 0x18))->m_data[2];
    auVar42 = vfmadd132sd_fma(auVar52,auVar42,auVar12);
    local_10c0._112_8_ = &local_b48;
    local_10c0._128_8_ = &local_b90;
    ChMatrix33<double>::ChMatrix33(&local_bd8,auVar42._0_8_);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                     *)auStack_df8,
                    (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                     *)local_10c0);
    local_d68 = &local_bd8;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)local_d20,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                *)local_e00);
    local_e00 = (undefined1  [8])0x0;
    local_10c0._0_8_ = (non_const_type)0x0;
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    xpr_00 = &this->G_i[lVar35].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>;
    auVar66._0_8_ = -local_f10.m_data[2];
    auVar66._8_8_ = 0x8000000000000000;
    auStack_df8._0_8_ = vmovlpd_avx(auVar66);
    local_de8 = local_f10.m_data[2];
    auVar19._8_8_ = local_f10.m_data[1];
    auVar19._0_8_ = local_f10.m_data[0];
    local_de0 = 0.0;
    auStack_df8._8_8_ = local_f10.m_data[1];
    local_dd8 = -local_f10.m_data[0];
    pMStack_dd0 = (LhsNested)((ulong)local_f10.m_data[1] ^ 0x8000000000000000);
    local_dc8 = (RhsNested)vmovlpd_avx(auVar19);
    local_dc0 = 0.0;
    auVar67._0_8_ = -local_f30.m_data[2];
    auVar67._8_8_ = 0x8000000000000000;
    local_10c0._8_8_ = vmovlpd_avx(auVar67);
    local_10c0._24_8_ = local_f30.m_data[2];
    auVar18._8_8_ = local_f30.m_data[1];
    auVar18._0_8_ = local_f30.m_data[0];
    local_10c0._32_8_ = 0.0;
    local_10c0._16_8_ = local_f30.m_data[1];
    local_10c0._40_8_ = (ulong)local_f30.m_data[0] ^ 0x8000000000000000;
    local_10c0._48_8_ = (ulong)local_f30.m_data[1] ^ 0x8000000000000000;
    local_10c0._56_8_ = vmovlpd_avx(auVar18);
    local_10c0._64_8_ = (RhsNested)0x0;
    auVar68._0_8_ = (ulong)local_f50.m_data[2] ^ 0x8000000000000000;
    auVar68._8_8_ = 0x8000000000000000;
    uVar40 = vmovlpd_avx(auVar68);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar40;
    local_1248._0_16_ = auVar28 << 0x40;
    local_1248._24_8_ = local_f50.m_data[2];
    auVar17._8_8_ = local_f50.m_data[1];
    auVar17._0_8_ = local_f50.m_data[0];
    local_1248._32_8_ = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)0x0;
    local_1248._16_8_ = local_f50.m_data[1];
    local_1248._40_8_ = -local_f50.m_data[0];
    local_1248._48_8_ = -local_f50.m_data[1];
    local_1248._56_8_ = vmovlpd_avx(auVar17);
    local_1248._64_8_ = 0.0;
    auVar69._0_8_ = -local_f70.m_data[2];
    auVar69._8_8_ = 0x8000000000000000;
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar69);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_f70.m_data[2];
    auVar16._8_8_ = local_f70.m_data[1];
    auVar16._0_8_ = local_f70.m_data[0];
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_f70.m_data[1];
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)((ulong)local_f70.m_data[0] ^ 0x8000000000000000);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -local_f70.m_data[1];
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         (double)vmovlpd_avx(auVar16);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,0xc,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_3,_3,_1,_3,_3> *)local_e00);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,0xc,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_3,_3,_1,_3,_3> *)local_10c0);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,0xc,6,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_3,_3,_1,_3,_3> *)local_1248);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,0xc,9,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               &local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>);
    local_cb0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_e00;
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,0,0xc,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_cb0);
    local_cb0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_10c0;
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,3,0xc,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_cb0);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_15,_15,_1,_15,_15> *)xpr_00,0xc,0xc,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)&local_c68,
               (Matrix<double,_3,_3,_1,_3,_3> *)local_d20);
  }
  pCVar37 = local_11a8;
  for (lVar35 = 0; lVar35 != 4; lVar35 = lVar35 + 1) {
    auVar53._8_8_ = 0;
    auVar53._0_8_ = this->alpha_i[lVar35];
    auVar15._8_8_ = 0x8000000000000000;
    auVar15._0_8_ = 0x8000000000000000;
    auVar42 = vxorpd_avx512vl(auVar53,auVar15);
    local_1248._0_8_ = (non_const_type)(auVar42._0_8_ * (double)(&w_i)[lVar35]);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)pCVar37;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_12,_0,_24,_12>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>_>
                      *)local_d20,(double *)local_1248,(StorageBaseType *)&local_11f8);
    local_10c0._16_8_ = local_d20._16_8_;
    local_10c0._24_8_ = local_d20._24_8_;
    local_10c0._40_8_ = local_1268;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,12,0,24,12>const>const,Eigen::Transpose<Eigen::Matrix<double,12,24,1,12,24>>const>,Eigen::Matrix<double,12,1,0,12,1>,0>>
              ((Matrix<double,_24,_1,_0,_24,_1> *)local_e00,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_12,_0,_24,_12>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>_>,_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>
                *)local_10c0);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_10c0,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3],0,0x18);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_10c0,
               (MatrixBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_> *)local_e00);
    local_1268 = local_1268 + 1;
    pCVar37 = pCVar37 + 1;
  }
  ChStateDelta::ChStateDelta((ChStateDelta *)&local_cb0,0x18,(ChIntegrable *)0x0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1f])(this,0,(ChStateDelta *)&local_cb0);
  for (lVar35 = 0; lVar35 != 4; lVar35 = lVar35 + 1) {
    this_01 = (MatrixBase<Eigen::Matrix<double,12,24,1,12,24>> *)(local_11a8 + lVar35);
    local_1248._0_16_ =
         (undefined1  [16])
         Eigen::MatrixBase<Eigen::Matrix<double,12,24,1,12,24>>::operator*
                   (this_01,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_cb0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,12,1,0,12,1>,Eigen::Product<Eigen::Matrix<double,12,24,1,12,24>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_12,_1,_0,_12,_1> *)local_10c0,
               (Product<Eigen::Matrix<double,_12,_24,_1,_12,_24>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)local_1248);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_10c0,0,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_c20,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_1248,(type *)0x0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_10c0,3,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_b48,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_1248,(type *)0x0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_10c0,6,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_b90,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_1248,(type *)0x0);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_10c0,9,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_bd8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               local_1248,(type *)0x0);
    local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_ff0._16_8_ = 0.0;
    local_1010._16_8_ = 0.0;
    local_1030._16_8_ = 0.0;
    local_1140._16_8_ = 0.0;
    local_1160._16_8_ = 0.0;
    local_1180._16_8_ = 0.0;
    local_1110 = 0.0;
    local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_ff0._0_8_ = 0.0;
    local_ff0._8_8_ = 0.0;
    local_1010._0_8_ = 0.0;
    local_1010._8_8_ = 0.0;
    local_1030._0_8_ = 0.0;
    local_1030._8_8_ = 0.0;
    local_1140._0_8_ = 0.0;
    local_1140._8_8_ = 0.0;
    local_1160._0_8_ = 0.0;
    local_1160._8_8_ = 0.0;
    local_1180._0_8_ = 0.0;
    local_1180._8_8_ = 0.0;
    local_1140._32_8_ = 0.0;
    dStack_1118 = 0.0;
    lVar39 = 8;
    lVar38 = 4;
    uVar40 = 0;
    while( true ) {
      pLVar13 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar13) / 0x28) <=
          uVar40) break;
      std::__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )&local_11f8,
                   (__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )((long)&pLVar13->m_element + lVar39));
      std::__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> *)
                 local_1248,
                 (__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> *)
                 ((((PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_> *)
                   local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0])->m_storage).m_data.array + 5));
      uVar29 = local_1248._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1248 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 1));
      if ((LhsNested)uVar29 != (LhsNested)0x0) {
        std::__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                      *)&local_11f8,
                     (__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                      *)((long)&((this->m_layers).
                                 super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_element + lVar39));
        std::__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> *)
                   local_1248,
                   (__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> *)
                   ((((PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_> *)
                     local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0])->m_storage).m_data.array + 5));
        pdVar14 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (**(code **)((long)(((PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_> *)
                            local_1248._0_8_)->m_storage).m_data.array[0] + 0x10))
                  (pdVar14[uVar40],pdVar14[uVar40 + 1],
                   (&((this->m_layers).
                      super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_element)[lVar38],
                   local_1248._0_8_,local_1140,local_1160,local_1180,local_1140 + 0x20,&local_c20,
                   &local_b48,&local_b90,&local_bd8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1248 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 1));
        local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_1140._0_8_ +
                   local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[0];
        local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = (double)local_1140._8_8_ +
                   local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[1];
        local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = (double)local_1140._16_8_ +
                   local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2];
        local_ff0._0_8_ = (double)local_1160._0_8_ + (double)local_ff0._0_8_;
        local_ff0._8_8_ = (double)local_1160._8_8_ + (double)local_ff0._8_8_;
        local_ff0._16_8_ = (double)local_1160._16_8_ + (double)local_ff0._16_8_;
        local_1010._0_8_ = (double)local_1180._0_8_ + (double)local_1010._0_8_;
        local_1010._8_8_ = (double)local_1180._8_8_ + (double)local_1010._8_8_;
        local_1010._16_8_ = (double)local_1180._16_8_ + (double)local_1010._16_8_;
        local_1030._0_8_ = (double)local_1140._32_8_ + (double)local_1030._0_8_;
        local_1030._8_8_ = dStack_1118 + (double)local_1030._8_8_;
        local_1030._16_8_ = local_1110 + (double)local_1030._16_8_;
      }
      uVar40 = uVar40 + 1;
      lVar38 = lVar38 + 5;
      lVar39 = lVar39 + 0x28;
    }
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(local_ff0 + 0x20);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_d20,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_1248,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_11f8);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_ff0;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_d20,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_1248,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_11f8);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_1010;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_d20,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_1248,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_11f8);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_1030;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_1248,
               (Matrix<double,_12,_1,_0,_12,_1> *)local_d20,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_1248,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_11f8);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = this->alpha_i[lVar35];
    auVar42._8_8_ = 0x8000000000000000;
    auVar42._0_8_ = 0x8000000000000000;
    auVar42 = vxorpd_avx512vl(auVar54,auVar42);
    local_ed0 = auVar42._0_8_ * (double)(&w_i)[lVar35];
    local_ef0 = this_01;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_12,_0,_24,_12>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>_>
                      *)&local_c68,&local_ed0,(StorageBaseType *)&local_ef0);
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_c68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_c68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    local_11f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)local_d20;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_1248,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               local_fd0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3],0,0x18);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_1248,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_12,_0,_24,_12>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>_>,_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>_>
                *)&local_11f8);
  }
  Eigen::internal::handmade_aligned_free
            ((void *)local_cb0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0]);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    Fi.setZero();

    UpdateNodalAndAveragePosAndOrientation();
    InterpolateOrientation();

    /*
	for (unsigned int i = 1; i <= iGetNumDof(); i++) {
		beta(i) = XCurr(iFirstReactionIndex + i);
	}
    */  //***TODO*** EAS internal variables not yet implemented

    ComputeIPCurvature();
    for (int i = 0; i < NUMIP; i++) {
        InterpDeriv(xa, L_alpha_beta_i[i], y_i_1[i], y_i_2[i]);
        eps_tilde_1_i[i] = T_i[i].transpose() * y_i_1[i] - eps_tilde_1_0_i[i];
        eps_tilde_2_i[i] = T_i[i].transpose() * y_i_2[i] - eps_tilde_2_0_i[i];
        k_tilde_1_i[i] = T_i[i].transpose() * k_1_i[i] - k_tilde_1_0_i[i];
        k_tilde_2_i[i] = T_i[i].transpose() * k_2_i[i] - k_tilde_2_0_i[i];

        ChStarMatrix33<> myi_1_X(y_i_1[i]);
        ChStarMatrix33<> myi_2_X(y_i_2[i]);
        ChStarMatrix33<> mk_1_X(k_1_i[i]);
        ChStarMatrix33<> mk_2_X(k_2_i[i]);
        ChMatrix33<> block;

        // parte variabile di B_overline_i
        for (int n = 0; n < NUMNODES; n++) {
            ChMatrix33<> Phi_Delta_i_n_LI_i = Phi_Delta_i[i][n] * LI[n](xi_i[i]);

            // delta epsilon_tilde_1_i
            block = T_i[i] * L_alpha_beta_i[i](n, 0);
            B_overline_i[i].block(0, 6 * n, 3, 3) = block.transpose();
            block = T_i[i].transpose() * myi_1_X * Phi_Delta_i_n_LI_i;
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(0, 3 + 6 * n, 3, 3) = block;

            // delta epsilon_tilde_2_i
            block = T_i[i] * L_alpha_beta_i[i](n, 1);
            B_overline_i[i].block(3, 6 * n, 3, 3) = block.transpose();
            block = T_i[i].transpose() * myi_2_X * Phi_Delta_i_n_LI_i;
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(3, 3 + 6 * n, 3, 3) = block;

            ChVector<> phi_tilde_1_i;
            ChVector<> phi_tilde_2_i;
            InterpDeriv(phi_tilde_n, L_alpha_beta_i[i], phi_tilde_1_i, phi_tilde_2_i);

            // delta k_tilde_1_i
            block = T_i[i].transpose() * mk_1_X * Phi_Delta_i_n_LI_i + T_i[i].transpose() * Kappa_delta_i_1[i][n];
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(6, 3 + 6 * n, 3, 3) = block;

            // delta k_tilde_2_i
            block = T_i[i].transpose() * mk_2_X * Phi_Delta_i_n_LI_i + T_i[i].transpose() * Kappa_delta_i_2[i][n];
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(9, 3 + 6 * n, 3, 3) = block;

            // delta y_alpha_1
            block = ChMatrix33<>::Identity() * L_alpha_beta_i[i](n, 0);
            D_overline_i[i].block(0, 6 * n, 3, 3) = block;

            // delta y_alpha_2
            block = ChMatrix33<>::Identity() * L_alpha_beta_i[i](n, 1);
            D_overline_i[i].block(3, 6 * n, 3, 3) = block;

            // delta k_1_i
            block = Kappa_delta_i_1[i][n] * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(6, 3 + 6 * n, 3, 3) = block;

            // delta k_2_i
            block = Kappa_delta_i_2[i][n] * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(9, 3 + 6 * n, 3, 3) = block;

            // phi_delta
            block = Phi_Delta_i_n_LI_i * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(12, 3 + 6 * n, 3, 3) = block;
        }
    }

// ANS
#ifdef CHUSE_ANS

    ChMatrixNM<double, 6, 24> B_overline_A;
    ChVector<> y_A_1;
    ChVector<> y_A_2;
    ChMatrixNM<double, 4, 24> B_overline_3_ABCD;
    ChMatrixNM<double, 4, 24> B_overline_6_ABCD;

    for (int i = 0; i < NUMSSEP; i++) {
        B_overline_A.setZero();
        InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
        eps_tilde_1_A[i] = T_A[i].transpose() * y_A_1 - eps_tilde_1_0_A[i];
        eps_tilde_2_A[i] = T_A[i].transpose() * y_A_2 - eps_tilde_2_0_A[i];

        ChStarMatrix33<> myA_1_X(y_A_1);
        ChStarMatrix33<> myA_2_X(y_A_2);
        ChMatrix33<> block;

        for (int n = 0; n < NUMNODES; n++) {
            ChMatrix33<> Phi_Delta_A_n_LI_i = Phi_Delta_A[i][n] * LI[n](xi_A[i]);

            // delta epsilon_tilde_1_A
            block = T_A[i].transpose() * L_alpha_beta_A[i](n, 0);
            B_overline_A.block(0, 6 * n, 3, 3) = block;
            block = T_A[i].transpose() * myA_1_X * Phi_Delta_A_n_LI_i;
            block = block * this->m_nodes[n]->GetA();  //***NEEDED because in chrono rotations are body-relative
            B_overline_A.block(0, 3 + 6 * n, 3, 3) = block;

            // delta epsilon_tilde_2_A
            block = T_A[i].transpose() * L_alpha_beta_A[i](n, 1);
            B_overline_A.block(3, 6 * n, 3, 3) = block;
            block = T_A[i].transpose() * myA_2_X * Phi_Delta_A_n_LI_i;
            block = block * this->m_nodes[n]->GetA();  //***NEEDED because in chrono rotations are body-relative
            B_overline_A.block(3, 3 + 6 * n, 3, 3) = block;
        }

        B_overline_3_ABCD.row(i) = B_overline_A.row(2);
        B_overline_6_ABCD.row(i) = B_overline_A.row(5);
    }

    for (int i = 0; i < NUMIP; i++) {
        ChMatrixNM<double, 1, 4> sh1;
        ChMatrixNM<double, 1, 4> sh2;
        sh1(0, 0) = (1. + xi_i[i][1]) * 0.5;
        sh1(0, 1) = 0;
        sh1(0, 2) = (1. - xi_i[i][1]) * 0.5;
        sh1(0, 3) = 0;

        sh2(0, 0) = 0;
        sh2(0, 1) = (1. - xi_i[i][0]) * 0.5;
        sh2(0, 2) = 0;
        sh2(0, 3) = (1. + xi_i[i][0]) * 0.5;

        eps_tilde_1_i[i].z() = sh1(0, 0) * eps_tilde_1_A[0].z() + sh1(0, 2) * eps_tilde_1_A[2].z();
        eps_tilde_2_i[i].z() = sh2(0, 1) * eps_tilde_2_A[1].z() + sh2(0, 3) * eps_tilde_2_A[3].z();

        B_overline_i[i].row(2) = sh1 * B_overline_3_ABCD;
        B_overline_i[i].row(5) = sh2 * B_overline_6_ABCD;
    }

#endif

    // EAS: B membranali
    // 	{
    // 		int tmpidx1[5] = {0, 1, 5, 4, 2};
    // 		for (int i = 0; i < NUMIP; i++) {
    // 			for (int n = 1; n <= 4; n++) {
    //#if 0
    // 				CopyMatrixRow(B_overline_m_i[i], n, B_overline_i[i], tmpidx1[n]);
    //#endif
    // 				B_overline_m_i[i].CopyMatrixRow(n, B_overline_i[i], tmpidx1[n]);
    // 			}
    // 		}
    // 	}

    /* Calcola le azioni interne */
    for (int i = 0; i < NUMIP; i++) {
        epsilon.segment(0, 3) = eps_tilde_1_i[i].eigen();
        epsilon.segment(3, 3) = eps_tilde_2_i[i].eigen();
        epsilon.segment(6, 3) = k_tilde_1_i[i].eigen();
        epsilon.segment(9, 3) = k_tilde_2_i[i].eigen();

        //***TODO*** add the EAS effect using the epsilon_hat
        // epsilon_hat = P_i[i] * beta;
        // epsilon += epsilon_hat;

        ChVector<> eps_tot_1(epsilon.segment(0, 3));
        ChVector<> eps_tot_2(epsilon.segment(3, 3));
        ChVector<> k_tot_1(epsilon.segment(6, 3));
        ChVector<> k_tot_2(epsilon.segment(9, 3));

        // Compute strains using
        // constitutive law of material

        ChVector<> n1, n2, m1, m2;
        ChVector<> l_n1, l_n2, l_m1, l_m2;
        // loop on layers
        for (size_t il = 0; il < this->m_layers.size(); ++il) {
            // compute layer stresses (per-unit-length forces and torques), and accumulate
            m_layers[il].GetMaterial()->ComputeStress(l_n1, l_n2, l_m1, l_m2, eps_tot_1, eps_tot_2, k_tot_1, k_tot_2,
                                                      m_layers_z[il], m_layers_z[il + 1], m_layers[il].Get_theta());
            n1 += l_n1;
            n2 += l_n2;
            m1 += l_m1;
            m2 += l_m2;
        }

        stress_i[i].segment(0,3) = n1.eigen();
        stress_i[i].segment(3,3) = n2.eigen();
        stress_i[i].segment(6,3) = m1.eigen();
        stress_i[i].segment(9,3) = m2.eigen();

        ChMatrix33<> Hh;
        ChVector<> Tn1 = T_i[i] * n1;
        ChVector<> Tn2 = T_i[i] * n2;
        ChVector<> Tm1 = T_i[i] * m1;
        ChVector<> Tm2 = T_i[i] * m2;
        Hh = TensorProduct(Tn1, y_i_1[i]) - ChMatrix33<>(Tn1 ^ y_i_1[i]) + TensorProduct(Tn2, y_i_2[i]) -
             ChMatrix33<>(Tn2 ^ y_i_2[i]) + TensorProduct(Tm1, k_1_i[i]) - ChMatrix33<>(Tm1 ^ k_1_i[i]) +
             TensorProduct(Tm2, k_2_i[i]) - ChMatrix33<>(Tm2 ^ k_2_i[i]);

        ChStarMatrix33<> Tn1_tilde(Tn1);
        ChStarMatrix33<> Tn2_tilde(Tn2);
        ChStarMatrix33<> Tm1_tilde(Tm1);
        ChStarMatrix33<> Tm2_tilde(Tm2);

        G_i[i].block(12, 0, 3, 3) = Tn1_tilde;
        G_i[i].block(12, 3, 3, 3) = Tn2_tilde;
        G_i[i].block(12, 6, 3, 3) = Tm1_tilde;
        G_i[i].block(12, 9, 3, 3) = Tm2_tilde;
        G_i[i].block(0, 12, 3, 3) = Tn1_tilde.transpose();
        G_i[i].block(3, 12, 3, 3) = Tn2_tilde.transpose();
        G_i[i].block(12, 12, 3, 3) = Hh;
    }

    // Residual

    ChVectorN<double, 24> rd;
    for (int i = 0; i < NUMIP; i++) {
        rd = (-alpha_i[i] * w_i[i]) * B_overline_i[i].transpose() * stress_i[i];
        Fi.segment(0, 24) += rd;

#ifdef CHUSE_EAS
        double dCoef = 1.0;  //***TODO*** autoset this
        ChVectorN<double, IDOFS> rbeta;
        rbeta = (-alpha_i[i] * w_i[i] / dCoef) * P_i[i].transpose() * stress_i[i];
        Fi.segment(24, IDOFS) = rbeta;
#endif
    }

    // Add damping: 

    // fills velocities with speeds of nodes:
    // {dxdt_1, angular_vel_1,  dxdt_2, angular_vel_2, ...}
    // Note that angular velocities are in node local frame because in C::E angular
    // increments are assumed in local frame csys.
    ChStateDelta velocities(24, nullptr);
    this->LoadableGetStateBlock_w(0, velocities);

    // Note that, in case of ChDampingReissnerRayleigh (rayleigh damping), this
	// is like computing Fi_damping = -beta*[Km]*v   without explicitly building [Km],
    // rather exploit the factorization B'CB, as:
    //   Alpha*[Km]*v = beta * [sum_integraton_points ( [B_i]'*[C]*[B_i] * a_i * w_i )] *v
    //   Alpha*[Km]*v = sum_integraton_points ( [B_i]' * (beta * [C]*[B_i] *v) * a_i * w_i )
    //   Alpha*[Km]*v = sum_integraton_points ( [B_i]' * (   stress_damp_i    ) * a_i * w_i )
    // where for convenience we denoted stress_damp = beta*[C]*[B_i]*v

    ChVectorN<double, 12> strain_dt;
    ChVectorN<double, 12> stress_damp;

    for (int i = 0; i < NUMIP; i++) {
			
        strain_dt = B_overline_i[i] * velocities;  // [B_i] *v

        ChVector<> eps_dt_1(strain_dt.segment(0, 3));
        ChVector<> eps_dt_2(strain_dt.segment(3, 3));
        ChVector<> k_dt_1(strain_dt.segment(6, 3));
        ChVector<> k_dt_2(strain_dt.segment(9, 3));
        ChVector<> n1, n2, m1, m2;
        ChVector<> l_n1, l_n2, l_m1, l_m2;
        // loop on layers
        for (size_t il = 0; il < this->m_layers.size(); ++il) {

			if (m_layers[il].GetMaterial()->GetDamping()) {

				// compute layer stresses (per-unit-length forces and torques), and accumulate  [C]*[B_i]*v
				m_layers[il].GetMaterial()->GetDamping()->ComputeStress(l_n1, l_n2, l_m1, l_m2, eps_dt_1, eps_dt_2, k_dt_1, k_dt_2,
					m_layers_z[il], m_layers_z[il + 1], m_layers[il].Get_theta());
				n1 += l_n1;
				n2 += l_n2;
				m1 += l_m1;
				m2 += l_m2;
			}
        }
        stress_damp.segment(0, 3) = n1.eigen();
        stress_damp.segment(3, 3) = n2.eigen();
        stress_damp.segment(6, 3) = m1.eigen();
        stress_damp.segment(9, 3) = m2.eigen();

        Fi.segment(0, 24) += (-alpha_i[i] * w_i[i]) * B_overline_i[i].transpose() * stress_damp;
    }


}